

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::AddMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  Nonnull<const_char_*> failure_msg;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_00;
  MessageLite *pMVar2;
  int line;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  anon_enum_32 local_3c;
  LogMessageFatal local_38;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    local_38.super_LogMessage.errno_saver_.saved_errno_ = pEVar1->is_repeated ^ CPPTYPE_INT32;
    local_3c = REPEATED_FIELD;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::(anonymous_namespace)::__1,google::protobuf::internal::(anonymous_namespace)::__1>
                            ((anon_enum_32 *)&local_38,&local_3c,
                             "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == REPEATED_FIELD"
                            );
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_38.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(pEVar1->type);
      local_3c = 10;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                              ((CppType *)&local_38,&local_3c,
                               "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_MESSAGE");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        this_00 = pEVar1->field_0;
        goto LAB_001b6740;
      }
    }
    line = 0x357;
  }
  else {
    pEVar1->type = type;
    local_38.super_LogMessage.errno_saver_.saved_errno_ = anon_unknown_59::cpp_type(type);
    local_3c = 10;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_EQImpl<google::protobuf::internal::WireFormatLite::CppType,google::protobuf::internal::WireFormatLite::CppType>
                            ((CppType *)&local_38,&local_3c,
                             "cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      pEVar1->is_repeated = true;
      pEVar1->field_0xa = pEVar1->field_0xa | 1;
      this_00 = (anon_union_8_9_fdc4a54a_for_Extension_0)
                Arena::
                CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                          (this->arena_);
      pEVar1->field_0 = this_00;
LAB_001b6740:
      pMVar2 = RepeatedPtrFieldBase::AddMessage((RepeatedPtrFieldBase *)this_00,prototype);
      return pMVar2;
    }
    line = 0x351;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_38);
}

Assistant:

MessageLite* ExtensionSet::AddMessage(int number, FieldType type,
                                      const MessageLite& prototype,
                                      const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->ptr.repeated_message_value =
        Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, MESSAGE);
  }

  return reinterpret_cast<internal::RepeatedPtrFieldBase*>(
             extension->ptr.repeated_message_value)
      ->AddMessage(&prototype);
}